

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zgssvx.c
# Opt level: O1

void zgssvx(superlu_options_t *options,SuperMatrix *A,int *perm_c,int *perm_r,int *etree,char *equed
           ,double *R,double *C,SuperMatrix *L,SuperMatrix *U,void *work,int_t lwork,SuperMatrix *B,
           SuperMatrix *X,double *recip_pivot_growth,double *rcond,double *ferr,double *berr,
           GlobalLU_t *Glu,mem_usage_t *mem_usage,SuperLUStat_t *stat,int_t *info)

{
  double dVar1;
  byte bVar2;
  trans_t tVar3;
  yes_no_t yVar4;
  uint uVar5;
  int *piVar6;
  int *piVar7;
  int_t *piVar8;
  undefined8 uVar9;
  int_t iVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  double *pdVar15;
  int iVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  double *pdVar22;
  long lVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  double in_XMM1_Qa;
  double dVar27;
  double dVar28;
  SuperMatrix *local_e8;
  int local_d4;
  long local_d0;
  ulong local_c8;
  double *local_c0;
  fact_t local_b4;
  int info1;
  char norm [1];
  trans_t local_9c;
  double rowcnd;
  double colcnd;
  int local_70;
  int local_6c;
  long local_68;
  int *local_60;
  double amax;
  SuperMatrix AC;
  
  piVar6 = (int *)B->Store;
  piVar7 = (int *)X->Store;
  lVar23 = *(long *)(piVar6 + 2);
  lVar14 = *(long *)(piVar7 + 2);
  lVar11 = (long)*piVar6;
  local_d0 = (long)*piVar7;
  local_c8 = (ulong)(uint)B->ncol;
  *info = 0;
  tVar3 = options->Trans;
  bVar24 = tVar3 == NOTRANS;
  local_b4 = options->Fact;
  yVar4 = options->Equil;
  local_60 = etree;
  if (local_b4 == FACTORED) {
    bVar25 = (*equed & 0xefU) == 0x42;
    bVar26 = (*equed & 0xfeU) == 0x42;
    dVar28 = dmach("Safe minimum");
    in_XMM0_Da = SUB84(dVar28,0);
    in_XMM0_Db = (undefined4)((ulong)dVar28 >> 0x20);
    in_XMM1_Qa = 1.0 / dVar28;
  }
  else {
    *equed = 'N';
    bVar25 = false;
    bVar26 = false;
  }
  iVar10 = -1;
  if (((options->Fact < 4) && (options->Trans < (CONJ|TRANS))) && (options->Equil < 2)) {
    iVar12 = A->nrow;
    iVar10 = -2;
    if ((((-1 < (long)iVar12) && (iVar12 == A->ncol)) &&
        (((A->Stype & ~SLU_NR) == SLU_NC && ((A->Dtype == SLU_Z && (A->Mtype == SLU_GE)))))) &&
       ((options->Fact != FACTORED || (((bVar25 || (bVar26)) || (iVar10 = -6, *equed == 'N')))))) {
      if (bVar25) {
        dVar27 = 0.0;
        dVar28 = in_XMM1_Qa;
        if (0 < iVar12) {
          lVar13 = 0;
          do {
            dVar1 = R[lVar13];
            if (dVar1 <= dVar28) {
              dVar28 = dVar1;
            }
            if (dVar27 <= dVar1) {
              dVar27 = dVar1;
            }
            lVar13 = lVar13 + 1;
          } while (iVar12 != lVar13);
        }
        if (dVar28 <= 0.0) {
          *info = -7;
        }
        else if (iVar12 < 1) {
          rowcnd = 1.0;
        }
        else {
          if (dVar28 <= (double)CONCAT44(in_XMM0_Db,in_XMM0_Da)) {
            dVar28 = (double)CONCAT44(in_XMM0_Db,in_XMM0_Da);
          }
          if (in_XMM1_Qa <= dVar27) {
            dVar27 = in_XMM1_Qa;
          }
          rowcnd = dVar28 / dVar27;
        }
      }
      if ((bVar26) && (*info == 0)) {
        iVar12 = A->nrow;
        dVar27 = 0.0;
        dVar28 = in_XMM1_Qa;
        if (0 < (long)iVar12) {
          lVar13 = 0;
          do {
            dVar1 = C[lVar13];
            if (dVar1 <= dVar28) {
              dVar28 = dVar1;
            }
            if (dVar27 <= dVar1) {
              dVar27 = dVar1;
            }
            lVar13 = lVar13 + 1;
          } while (iVar12 != lVar13);
        }
        if (dVar28 <= 0.0) {
          *info = -8;
        }
        else if (iVar12 < 1) {
          colcnd = 1.0;
        }
        else {
          if (dVar28 <= (double)CONCAT44(in_XMM0_Db,in_XMM0_Da)) {
            dVar28 = (double)CONCAT44(in_XMM0_Db,in_XMM0_Da);
          }
          if (in_XMM1_Qa <= dVar27) {
            dVar27 = in_XMM1_Qa;
          }
          colcnd = dVar28 / dVar27;
        }
      }
      if (*info != 0) goto LAB_00103176;
      iVar10 = -0xc;
      if (lwork < -1) {
LAB_00103b6f:
        *info = iVar10;
      }
      else {
        iVar10 = -0xd;
        if (B->ncol < 0) goto LAB_00103b6f;
        if (B->ncol != 0) {
          iVar12 = 0;
          if (0 < A->nrow) {
            iVar12 = A->nrow;
          }
          if (((*piVar6 < iVar12) || (B->Stype != SLU_DN)) ||
             ((B->Dtype != SLU_Z || (B->Mtype != SLU_GE)))) goto LAB_00103b6f;
        }
      }
      iVar12 = X->ncol;
      iVar10 = -0xe;
      if (-1 < iVar12) {
        if (iVar12 == 0) goto LAB_00103176;
        iVar16 = 0;
        if (0 < A->nrow) {
          iVar16 = A->nrow;
        }
        if ((((iVar16 <= *piVar7) && (B->ncol == 0 || B->ncol == iVar12)) && (X->Stype == SLU_DN))
           && ((X->Dtype == SLU_Z && (X->Mtype == SLU_GE)))) goto LAB_00103176;
      }
    }
  }
  *info = iVar10;
LAB_00103176:
  if (*info == 0) {
    local_6c = sp_ienv(1);
    local_70 = sp_ienv(2);
    local_c0 = stat->utime;
    local_68 = lVar14;
    if (A->Stype == SLU_NR) {
      bVar24 = tVar3 != NOTRANS;
      local_9c = (trans_t)(tVar3 == NOTRANS);
      piVar8 = (int_t *)A->Store;
      local_e8 = (SuperMatrix *)superlu_malloc(0x20);
      lVar14 = local_68;
      zCreate_CompCol_Matrix
                (local_e8,A->ncol,A->nrow,*piVar8,*(doublecomplex **)(piVar8 + 2),
                 *(int_t **)(piVar8 + 4),*(int_t **)(piVar8 + 6),SLU_NC,A->Dtype,A->Mtype);
    }
    else {
      local_9c = options->Trans;
      local_e8 = A;
    }
    if ((local_b4 != FACTORED) && (yVar4 == YES)) {
      dVar28 = SuperLU_timer_();
      zgsequ(local_e8,R,C,&rowcnd,&colcnd,&amax,&info1);
      if (info1 == 0) {
        zlaqgs(local_e8,R,C,rowcnd,colcnd,amax,equed);
        bVar2 = *equed;
        bVar25 = (bVar2 & 0xef) == 0x42;
        bVar26 = true;
        if (bVar2 != 0x43) {
          bVar26 = bVar2 == 0x42;
        }
      }
      dVar27 = SuperLU_timer_();
      local_c0[4] = dVar27 - dVar28;
    }
    if (local_b4 != FACTORED) {
      dVar28 = SuperLU_timer_();
      if ((options->ColPerm != MY_PERMC) && (options->Fact == DOFACT)) {
        get_perm_c(options->ColPerm,local_e8,perm_c);
      }
      dVar27 = SuperLU_timer_();
      *local_c0 = dVar27 - dVar28;
      dVar28 = SuperLU_timer_();
      piVar6 = local_60;
      sp_preorder(options,local_e8,perm_c,local_60,&AC);
      dVar27 = SuperLU_timer_();
      local_c0[3] = dVar27 - dVar28;
      dVar28 = SuperLU_timer_();
      zgstrf(options,&AC,local_70,local_6c,piVar6,work,lwork,perm_c,perm_r,L,U,Glu,stat,info);
      dVar27 = SuperLU_timer_();
      local_c0[7] = dVar27 - dVar28;
      lVar14 = local_68;
      if (lwork == -1) {
        mem_usage->total_needed = (float)(*info - A->ncol);
        return;
      }
    }
    iVar12 = *info;
    if (iVar12 < 1) {
      if (options->PivotGrowth != NO) {
        dVar28 = zPivotGrowth(A->ncol,local_e8,perm_c,L,U);
        *recip_pivot_growth = dVar28;
      }
      if (options->ConditionNumber != NO) {
        dVar28 = SuperLU_timer_();
        norm[0] = 'I';
        if (bVar24) {
          norm[0] = '1';
        }
        dVar27 = zlangs(norm,local_e8);
        zgscon(norm,L,U,dVar27,rcond,stat,&info1);
        dVar27 = SuperLU_timer_();
        local_c0[0x10] = dVar27 - dVar28;
      }
      if (0 < (int)local_c8) {
        if (bVar24) {
          if (bVar25) {
            uVar5 = A->nrow;
            pdVar15 = (double *)(lVar23 + 8);
            uVar17 = 0;
            do {
              if (0 < (int)uVar5) {
                uVar20 = 0;
                pdVar22 = pdVar15;
                do {
                  pdVar22[-1] = pdVar22[-1] * R[uVar20];
                  *pdVar22 = *pdVar22 * R[uVar20];
                  uVar20 = uVar20 + 1;
                  pdVar22 = pdVar22 + 2;
                } while (uVar5 != uVar20);
              }
              uVar17 = uVar17 + 1;
              pdVar15 = pdVar15 + lVar11 * 2;
            } while (uVar17 != local_c8);
          }
        }
        else if (bVar26) {
          uVar5 = A->nrow;
          pdVar15 = (double *)(lVar23 + 8);
          uVar17 = 0;
          do {
            if (0 < (int)uVar5) {
              uVar20 = 0;
              pdVar22 = pdVar15;
              do {
                pdVar22[-1] = pdVar22[-1] * C[uVar20];
                *pdVar22 = *pdVar22 * C[uVar20];
                uVar20 = uVar20 + 1;
                pdVar22 = pdVar22 + 2;
              } while (uVar5 != uVar20);
            }
            uVar17 = uVar17 + 1;
            pdVar15 = pdVar15 + lVar11 * 2;
          } while (uVar17 != local_c8);
        }
        uVar17 = 1;
        if (1 < (int)local_c8) {
          uVar17 = local_c8 & 0xffffffff;
        }
        local_d0 = local_d0 * 0x10;
        uVar20 = 0;
        lVar13 = lVar14;
        do {
          lVar18 = 0;
          if (0 < B->nrow) {
            lVar21 = 0;
            lVar18 = 0;
            do {
              uVar9 = ((undefined8 *)(lVar23 + lVar21))[1];
              *(undefined8 *)(lVar13 + lVar21) = *(undefined8 *)(lVar23 + lVar21);
              ((undefined8 *)(lVar13 + lVar21))[1] = uVar9;
              lVar18 = lVar18 + 1;
              lVar21 = lVar21 + 0x10;
            } while (lVar18 < B->nrow);
          }
          uVar20 = uVar20 + 1;
          lVar23 = lVar23 + lVar11 * 0x10;
          lVar13 = lVar13 + local_d0;
        } while (uVar20 != uVar17);
        local_d4 = (int)lVar18;
        dVar28 = SuperLU_timer_();
        zgstrs(local_9c,L,U,perm_c,perm_r,X,stat,&info1);
        dVar27 = SuperLU_timer_();
        local_c0[0x11] = dVar27 - dVar28;
        dVar28 = SuperLU_timer_();
        if (options->IterRefine == NOREFINE) {
          uVar17 = 1;
          if (1 < (int)local_c8) {
            uVar17 = local_c8 & 0xffffffff;
          }
          uVar20 = 0;
          do {
            berr[uVar20] = 1.0;
            ferr[uVar20] = 1.0;
            uVar20 = uVar20 + 1;
          } while (uVar17 != uVar20);
        }
        else {
          zgsrfs(local_9c,local_e8,L,U,perm_c,perm_r,equed,R,C,B,X,ferr,berr,stat,&info1);
        }
        dVar27 = SuperLU_timer_();
        local_c0[0x12] = dVar27 - dVar28;
        if (bVar24) {
          if (bVar26) {
            uVar5 = A->nrow;
            uVar17 = 1;
            if (1 < (int)local_c8) {
              uVar17 = local_c8 & 0xffffffff;
            }
            pdVar15 = (double *)(lVar14 + 8);
            uVar20 = 0;
            do {
              uVar19 = 0;
              if (0 < (int)uVar5) {
                uVar19 = 0;
                pdVar22 = pdVar15;
                do {
                  pdVar22[-1] = pdVar22[-1] * C[uVar19];
                  *pdVar22 = *pdVar22 * C[uVar19];
                  uVar19 = uVar19 + 1;
                  pdVar22 = pdVar22 + 2;
                } while (uVar5 != uVar19);
              }
              local_d4 = (int)uVar19;
              uVar20 = uVar20 + 1;
              pdVar15 = (double *)((long)pdVar15 + local_d0);
            } while (uVar20 != uVar17);
          }
        }
        else if (bVar25) {
          uVar5 = A->nrow;
          uVar17 = 1;
          if (1 < (int)local_c8) {
            uVar17 = local_c8 & 0xffffffff;
          }
          pdVar15 = (double *)(lVar14 + 8);
          uVar20 = 0;
          do {
            uVar19 = 0;
            if (0 < (int)uVar5) {
              uVar19 = 0;
              pdVar22 = pdVar15;
              do {
                pdVar22[-1] = pdVar22[-1] * R[uVar19];
                *pdVar22 = *pdVar22 * R[uVar19];
                uVar19 = uVar19 + 1;
                pdVar22 = pdVar22 + 2;
              } while (uVar5 != uVar19);
            }
            local_d4 = (int)uVar19;
            uVar20 = uVar20 + 1;
            pdVar15 = (double *)((long)pdVar15 + local_d0);
          } while (uVar20 != uVar17);
        }
      }
      if ((options->ConditionNumber != NO) &&
         (dVar28 = *rcond, dVar27 = dmach("E"), dVar28 < dVar27)) {
        *info = A->ncol + 1;
      }
      if (local_b4 != FACTORED) {
        zQuerySpace(L,U,mem_usage);
        Destroy_CompCol_Permuted(&AC);
      }
      if (A->Stype == SLU_NR) {
        Destroy_SuperMatrix_Store(local_e8);
        superlu_free(local_e8);
      }
    }
    else if (iVar12 <= A->ncol) {
      dVar28 = zPivotGrowth(iVar12,local_e8,perm_c,L,U);
      *recip_pivot_growth = dVar28;
    }
  }
  else {
    local_d4 = -*info;
    input_error("zgssvx",&local_d4);
  }
  return;
}

Assistant:

void
zgssvx(superlu_options_t *options, SuperMatrix *A, int *perm_c, int *perm_r,
       int *etree, char *equed, double *R, double *C,
       SuperMatrix *L, SuperMatrix *U, void *work, int_t lwork,
       SuperMatrix *B, SuperMatrix *X, double *recip_pivot_growth, 
       double *rcond, double *ferr, double *berr, 
       GlobalLU_t *Glu, mem_usage_t *mem_usage, SuperLUStat_t *stat, int_t *info )
{

    DNformat  *Bstore, *Xstore;
    doublecomplex    *Bmat, *Xmat;
    int       ldb, ldx, nrhs;
    SuperMatrix *AA;/* A in SLU_NC format used by the factorization routine.*/
    SuperMatrix AC; /* Matrix postmultiplied by Pc */
    int       colequ, equil, nofact, notran, rowequ, permc_spec;
    trans_t   trant;
    char      norm[1];
    int       i, j, info1;
    double    amax, anorm, bignum, smlnum, colcnd, rowcnd, rcmax, rcmin;
    int       relax, panel_size;
    double    t0;      /* temporary time */
    double    *utime;

    /* External functions */
    extern double zlangs(char *, SuperMatrix *);

    Bstore = B->Store;
    Xstore = X->Store;
    Bmat   = Bstore->nzval;
    Xmat   = Xstore->nzval;
    ldb    = Bstore->lda;
    ldx    = Xstore->lda;
    nrhs   = B->ncol;

    *info = 0;
    nofact = (options->Fact != FACTORED);
    equil = (options->Equil == YES);
    notran = (options->Trans == NOTRANS);
    if ( nofact ) {
	*(unsigned char *)equed = 'N';
	rowequ = FALSE;
	colequ = FALSE;
    } else {
	rowequ = strncmp(equed, "R", 1)==0 || strncmp(equed, "B", 1)==0;
	colequ = strncmp(equed, "C", 1)==0 || strncmp(equed, "B", 1)==0;
	smlnum = dmach("Safe minimum");   /* lamch_("Safe minimum"); */
	bignum = 1. / smlnum;
    }

#if 0
printf("dgssvx: Fact=%4d, Trans=%4d, equed=%c\n",
       options->Fact, options->Trans, *equed);
#endif

    /* Test the input parameters */
    if ( (options->Fact != DOFACT && options->Fact != SamePattern &&
	  options->Fact != SamePattern_SameRowPerm &&
	  options->Fact != FACTORED) || 
	 (options->Trans != NOTRANS && options->Trans != TRANS && 
	  options->Trans != CONJ) ||
	 (options->Equil != NO && options->Equil != YES) )
	 *info = -1;
    else if ( A->nrow != A->ncol || A->nrow < 0 ||
	      (A->Stype != SLU_NC && A->Stype != SLU_NR) ||
	      A->Dtype != SLU_Z || A->Mtype != SLU_GE )
	*info = -2;
    else if ( options->Fact == FACTORED &&
	     !(rowequ || colequ || strncmp(equed, "N", 1)==0) )
	*info = -6;
    else {
	if (rowequ) {
	    rcmin = bignum;
	    rcmax = 0.;
	    for (j = 0; j < A->nrow; ++j) {
		rcmin = SUPERLU_MIN(rcmin, R[j]);
		rcmax = SUPERLU_MAX(rcmax, R[j]);
	    }
	    if (rcmin <= 0.) *info = -7;
	    else if ( A->nrow > 0)
		rowcnd = SUPERLU_MAX(rcmin,smlnum) / SUPERLU_MIN(rcmax,bignum);
	    else rowcnd = 1.;
	}
	if (colequ && *info == 0) {
	    rcmin = bignum;
	    rcmax = 0.;
	    for (j = 0; j < A->nrow; ++j) {
		rcmin = SUPERLU_MIN(rcmin, C[j]);
		rcmax = SUPERLU_MAX(rcmax, C[j]);
	    }
	    if (rcmin <= 0.) *info = -8;
	    else if (A->nrow > 0)
		colcnd = SUPERLU_MAX(rcmin,smlnum) / SUPERLU_MIN(rcmax,bignum);
	    else colcnd = 1.;
	}
	if (*info == 0) {
	    if ( lwork < -1 ) *info = -12;
	    else if ( B->ncol < 0 ) *info = -13;
	    else if ( B->ncol > 0 ) { /* no checking if B->ncol=0 */
	         if ( Bstore->lda < SUPERLU_MAX(0, A->nrow) ||
		      B->Stype != SLU_DN || B->Dtype != SLU_Z || 
		      B->Mtype != SLU_GE )
		*info = -13;
            }
	    if ( X->ncol < 0 ) *info = -14;
            else if ( X->ncol > 0 ) { /* no checking if X->ncol=0 */
                 if ( Xstore->lda < SUPERLU_MAX(0, A->nrow) ||
		      (B->ncol != 0 && B->ncol != X->ncol) ||
                      X->Stype != SLU_DN ||
		      X->Dtype != SLU_Z || X->Mtype != SLU_GE )
		*info = -14;
            }
	}
    }
    if (*info != 0) {
	i = -(*info);
	input_error("zgssvx", &i);
	return;
    }
    
    /* Initialization for factor parameters */
    panel_size = sp_ienv(1);
    relax      = sp_ienv(2);

    utime = stat->utime;
    
    /* Convert A to SLU_NC format when necessary. */
    if ( A->Stype == SLU_NR ) {
	NRformat *Astore = A->Store;
	AA = (SuperMatrix *) SUPERLU_MALLOC( sizeof(SuperMatrix) );
	zCreate_CompCol_Matrix(AA, A->ncol, A->nrow, Astore->nnz, 
			       Astore->nzval, Astore->colind, Astore->rowptr,
			       SLU_NC, A->Dtype, A->Mtype);
	if ( notran ) { /* Reverse the transpose argument. */
	    trant = TRANS;
	    notran = 0;
	} else {
	    trant = NOTRANS;
	    notran = 1;
	}
    } else { /* A->Stype == SLU_NC */
	trant = options->Trans;
	AA = A;
    }

    if ( nofact && equil ) {
	t0 = SuperLU_timer_();
	/* Compute row and column scalings to equilibrate the matrix A. */
	zgsequ(AA, R, C, &rowcnd, &colcnd, &amax, &info1);
	
	if ( info1 == 0 ) {
	    /* Equilibrate matrix A. */
	    zlaqgs(AA, R, C, rowcnd, colcnd, amax, equed);
	    rowequ = strncmp(equed, "R", 1)==0 || strncmp(equed, "B", 1)==0;
	    colequ = strncmp(equed, "C", 1)==0 || strncmp(equed, "B", 1)==0;
	}
	utime[EQUIL] = SuperLU_timer_() - t0;
    }


    if ( nofact ) {
	
        t0 = SuperLU_timer_();
	/*
	 * Gnet column permutation vector perm_c[], according to permc_spec:
	 *   permc_spec = NATURAL:  natural ordering 
	 *   permc_spec = MMD_AT_PLUS_A: minimum degree on structure of A'+A
	 *   permc_spec = MMD_ATA:  minimum degree on structure of A'*A
	 *   permc_spec = COLAMD:   approximate minimum degree column ordering
	 *   permc_spec = MY_PERMC: the ordering already supplied in perm_c[]
	 */
	permc_spec = options->ColPerm;
	if ( permc_spec != MY_PERMC && options->Fact == DOFACT )
            get_perm_c(permc_spec, AA, perm_c);
	utime[COLPERM] = SuperLU_timer_() - t0;

	t0 = SuperLU_timer_();
	sp_preorder(options, AA, perm_c, etree, &AC);
	utime[ETREE] = SuperLU_timer_() - t0;
    
/*	printf("Factor PA = LU ... relax %d\tw %d\tmaxsuper %d\trowblk %d\n", 
	       relax, panel_size, sp_ienv(3), sp_ienv(4));
	fflush(stdout); */
	
	/* Compute the LU factorization of A*Pc. */
	t0 = SuperLU_timer_();
	zgstrf(options, &AC, relax, panel_size, etree,
                work, lwork, perm_c, perm_r, L, U, Glu, stat, info);
	utime[FACT] = SuperLU_timer_() - t0;
	
	if ( lwork == -1 ) {
	    mem_usage->total_needed = *info - A->ncol;
	    return;
	}
    }

    if ( *info > 0 ) { 
        if ( *info <= A->ncol ) { /* singular */
	    /* Compute the reciprocal pivot growth factor of the leading
	       rank-deficient (*info) columns of A. */
	    *recip_pivot_growth = zPivotGrowth(*info, AA, perm_c, L, U);
        }
	return;
    }

    /* *info == 0 at this point. */

    if ( options->PivotGrowth ) {
        /* Compute the reciprocal pivot growth factor *recip_pivot_growth. */
        *recip_pivot_growth = zPivotGrowth(A->ncol, AA, perm_c, L, U);
    }

    if ( options->ConditionNumber ) {
        /* Estimate the reciprocal of the condition number of A. */
        t0 = SuperLU_timer_();
        if ( notran ) {
	    *(unsigned char *)norm = '1';
        } else {
	    *(unsigned char *)norm = 'I';
        }
        anorm = zlangs(norm, AA);
        zgscon(norm, L, U, anorm, rcond, stat, &info1);
        utime[RCOND] = SuperLU_timer_() - t0;
    }
    
    if ( nrhs > 0 ) {
        /* Scale the right hand side if equilibration was performed. */
        if ( notran ) {
	    if ( rowequ ) {
	        for (j = 0; j < nrhs; ++j)
		    for (i = 0; i < A->nrow; ++i)
                        zd_mult(&Bmat[i+j*ldb], &Bmat[i+j*ldb], R[i]);
	    }
        } else if ( colequ ) {
	    for (j = 0; j < nrhs; ++j)
	        for (i = 0; i < A->nrow; ++i)
                    zd_mult(&Bmat[i+j*ldb], &Bmat[i+j*ldb], C[i]);
        }

        /* Compute the solution matrix X. */
        for (j = 0; j < nrhs; j++)  /* Save a copy of the right hand sides */
            for (i = 0; i < B->nrow; i++)
	        Xmat[i + j*ldx] = Bmat[i + j*ldb];
    
        t0 = SuperLU_timer_();
        zgstrs (trant, L, U, perm_c, perm_r, X, stat, &info1);
        utime[SOLVE] = SuperLU_timer_() - t0;
    
        /* Use iterative refinement to improve the computed solution and compute
           error bounds and backward error estimates for it. */
        t0 = SuperLU_timer_();
        if ( options->IterRefine != NOREFINE ) {
            zgsrfs(trant, AA, L, U, perm_c, perm_r, equed, R, C, B,
                   X, ferr, berr, stat, &info1);
        } else {
            for (j = 0; j < nrhs; ++j) ferr[j] = berr[j] = 1.0;
        }
        utime[REFINE] = SuperLU_timer_() - t0;

        /* Transform the solution matrix X to a solution of the original system. */
        if ( notran ) {
	    if ( colequ ) {
	        for (j = 0; j < nrhs; ++j)
		    for (i = 0; i < A->nrow; ++i)
                        zd_mult(&Xmat[i+j*ldx], &Xmat[i+j*ldx], C[i]);
	    }
        } else if ( rowequ ) {
	    for (j = 0; j < nrhs; ++j)
	        for (i = 0; i < A->nrow; ++i)
                    zd_mult(&Xmat[i+j*ldx], &Xmat[i+j*ldx], R[i]);
        }
    } /* end if nrhs > 0 */

    if ( options->ConditionNumber ) {
        /* Set INFO = A->ncol+1 if the matrix is singular to working precision. */
        /*if ( *rcond < dlamch_("E") ) *info = A->ncol + 1;*/
        if ( *rcond < dmach("E") ) *info = A->ncol + 1;
    }

    if ( nofact ) {
        zQuerySpace(L, U, mem_usage);
        Destroy_CompCol_Permuted(&AC);
    }
    if ( A->Stype == SLU_NR ) {
	Destroy_SuperMatrix_Store(AA);
	SUPERLU_FREE(AA);
    }

}